

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O2

void __thiscall BaseNode::DeleteConnection(BaseNode *this,Connection *connection)

{
  bool bVar1;
  const_iterator __position;
  
  __position._M_current =
       (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
       super__Vector_impl_data._M_start;
  while( true ) {
    if (__position._M_current ==
        (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    bVar1 = Connection::operator==(connection,__position._M_current);
    if (bVar1) break;
    __position._M_current = __position._M_current + 1;
  }
  std::vector<Connection,_std::allocator<Connection>_>::erase(&this->connections,__position);
  return;
}

Assistant:

void DeleteConnection(const Connection& connection)
    {
        for (auto it = connections.begin(); it != connections.end(); ++it)
        {
            if (connection == *it)
            {
                connections.erase(it);
                break;
            }
        }
    }